

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFont *font;
  ImFontConfig *pIVar3;
  float fVar4;
  float fVar5;
  ImGuiStyle *pIVar6;
  bool bVar7;
  bool bVar8;
  short sVar9;
  ImU32 IVar10;
  ImGuiStyle *pIVar11;
  char *pcVar12;
  size_t sVar13;
  ImGuiIO *pIVar14;
  ImFontGlyph *pIVar15;
  ImDrawList *pIVar16;
  int i;
  long lVar17;
  ImWchar c;
  int n_2;
  uint uVar18;
  int iVar19;
  ImVec4 *pIVar20;
  int i_1;
  uint base;
  uint c_begin;
  void *ptr_id;
  ImFontAtlas *pIVar21;
  uint n;
  ImGuiStyle *__dest;
  ulong uVar22;
  ImVec4 *pIVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool border;
  ImVec2 cell_p2;
  ImVec4 local_c8;
  ImGuiStyle *local_b8;
  float local_ac;
  float *local_a8;
  ImU32 local_9c;
  ImVec2 local_98;
  ImVec4 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  ImGuiIO *local_68;
  ImFontAtlas *local_60;
  long local_58;
  ImGuiStyle *local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar11 = GetStyle();
  local_b8 = pIVar11;
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar19 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar19 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
      pIVar11 = local_b8;
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,pIVar11,0x3bc);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar24 = GetWindowWidth();
  PushItemWidth(fVar24 * 0.5);
  bVar7 = ShowStyleSelector("Colors##Selector");
  if (bVar7) {
    memcpy(&ShowStyleEditor::ref_saved_style,pIVar11,0x3bc);
  }
  ShowFontSelector("Fonts##Selector");
  bVar7 = SliderFloat("FrameRounding",&pIVar11->FrameRounding,0.0,12.0,"%.0f",0);
  if (bVar7) {
    pIVar11->GrabRounding = pIVar11->FrameRounding;
  }
  local_c8.x._0_1_ = 0.0 < pIVar11->WindowBorderSize;
  bVar7 = Checkbox("WindowBorder",(bool *)&local_c8);
  if (bVar7) {
    if (local_c8.x._0_1_ == '\0') {
      fVar24 = 0.0;
    }
    else {
      fVar24 = 1.0;
    }
    pIVar11->WindowBorderSize = fVar24;
  }
  SameLine(0.0,-1.0);
  local_c8.x._0_1_ = 0.0 < pIVar11->FrameBorderSize;
  bVar7 = Checkbox("FrameBorder",(bool *)&local_c8);
  if (bVar7) {
    if (local_c8.x._0_1_ == '\0') {
      fVar24 = 0.0;
    }
    else {
      fVar24 = 1.0;
    }
    pIVar11->FrameBorderSize = fVar24;
  }
  SameLine(0.0,-1.0);
  local_c8.x._0_1_ = 0.0 < pIVar11->PopupBorderSize;
  bVar7 = Checkbox("PopupBorder",(bool *)&local_c8);
  if (bVar7) {
    if (local_c8.x._0_1_ == '\0') {
      fVar24 = 0.0;
    }
    else {
      fVar24 = 1.0;
    }
    pIVar11->PopupBorderSize = fVar24;
  }
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  bVar7 = Button("Save Ref",(ImVec2 *)&local_c8);
  pIVar6 = local_b8;
  if (bVar7) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_b8,0x3bc);
    memmove(__dest,pIVar6,0x3bc);
  }
  SameLine(0.0,-1.0);
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  bVar7 = Button("Revert Ref",(ImVec2 *)&local_c8);
  if (bVar7) {
    memcpy(local_b8,__dest,0x3bc);
  }
  SameLine(0.0,-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  Separator();
  bVar7 = BeginTabBar("##tabs",0);
  if (bVar7) {
    bVar7 = BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar7) {
      Text("Main");
      pIVar6 = local_b8;
      local_a8 = &pIVar11->FrameRounding;
      SliderFloat2("WindowPadding",&(local_b8->WindowPadding).x,0.0,20.0,"%.0f",0);
      SliderFloat2("FramePadding",&(pIVar6->FramePadding).x,0.0,20.0,"%.0f",0);
      SliderFloat2("ItemSpacing",&(pIVar6->ItemSpacing).x,0.0,20.0,"%.0f",0);
      SliderFloat2("ItemInnerSpacing",&(pIVar6->ItemInnerSpacing).x,0.0,20.0,"%.0f",0);
      SliderFloat2("TouchExtraPadding",&(pIVar6->TouchExtraPadding).x,0.0,10.0,"%.0f",0);
      SliderFloat("IndentSpacing",&pIVar6->IndentSpacing,0.0,30.0,"%.0f",0);
      SliderFloat("ScrollbarSize",&pIVar6->ScrollbarSize,1.0,20.0,"%.0f",0);
      SliderFloat("GrabMinSize",&pIVar6->GrabMinSize,1.0,20.0,"%.0f",0);
      Text("Borders");
      SliderFloat("WindowBorderSize",&pIVar11->WindowBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("ChildBorderSize",&pIVar6->ChildBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("PopupBorderSize",&pIVar11->PopupBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("FrameBorderSize",&pIVar11->FrameBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("TabBorderSize",&pIVar6->TabBorderSize,0.0,1.0,"%.0f",0);
      Text("Rounding");
      SliderFloat("WindowRounding",&pIVar6->WindowRounding,0.0,12.0,"%.0f",0);
      SliderFloat("ChildRounding",&pIVar6->ChildRounding,0.0,12.0,"%.0f",0);
      SliderFloat("FrameRounding",local_a8,0.0,12.0,"%.0f",0);
      SliderFloat("PopupRounding",&pIVar6->PopupRounding,0.0,12.0,"%.0f",0);
      SliderFloat("ScrollbarRounding",&pIVar6->ScrollbarRounding,0.0,12.0,"%.0f",0);
      SliderFloat("GrabRounding",&pIVar6->GrabRounding,0.0,12.0,"%.0f",0);
      SliderFloat("LogSliderDeadzone",&pIVar6->LogSliderDeadzone,0.0,12.0,"%.0f",0);
      SliderFloat("TabRounding",&pIVar6->TabRounding,0.0,12.0,"%.0f",0);
      Text("Alignment");
      SliderFloat2("WindowTitleAlign",&(pIVar6->WindowTitleAlign).x,0.0,1.0,"%.2f",0);
      local_c8.x = (float)(pIVar6->WindowMenuButtonPosition + 1);
      bVar7 = Combo("WindowMenuButtonPosition",(int *)&local_c8,"None",-1);
      if (bVar7) {
        pIVar6->WindowMenuButtonPosition = (int)local_c8.x + -1;
      }
      Combo("ColorButtonPosition",&pIVar6->ColorButtonPosition,"Left",-1);
      SliderFloat2("ButtonTextAlign",&(pIVar6->ButtonTextAlign).x,0.0,1.0,"%.2f",0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      SliderFloat2("SelectableTextAlign",&(pIVar6->SelectableTextAlign).x,0.0,1.0,"%.2f",0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      Text("Safe Area Padding");
      SameLine(0.0,-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      SliderFloat2("DisplaySafeAreaPadding",&(pIVar6->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",0);
      EndTabItem();
    }
    bVar7 = BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar7) {
      local_c8.x = 0.0;
      local_c8.y = 0.0;
      bVar7 = Button("Export",(ImVec2 *)&local_c8);
      if (bVar7) {
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard(-1);
        }
        else {
          LogToTTY(-1);
        }
        pIVar11 = local_b8;
        lVar17 = 0;
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        pIVar23 = pIVar11->Colors;
        pIVar20 = __dest->Colors;
        do {
          pcVar12 = GetStyleColorName((ImGuiCol)lVar17);
          if ((ShowStyleEditor::output_only_modified != true) ||
             (auVar25[0] = -(*(char *)&pIVar20->x == *(char *)&pIVar23->x),
             auVar25[1] = -(*(char *)((long)&pIVar20->x + 1) == *(char *)((long)&pIVar23->x + 1)),
             auVar25[2] = -(*(char *)((long)&pIVar20->x + 2) == *(char *)((long)&pIVar23->x + 2)),
             auVar25[3] = -(*(char *)((long)&pIVar20->x + 3) == *(char *)((long)&pIVar23->x + 3)),
             auVar25[4] = -(*(char *)&pIVar20->y == *(char *)&pIVar23->y),
             auVar25[5] = -(*(char *)((long)&pIVar20->y + 1) == *(char *)((long)&pIVar23->y + 1)),
             auVar25[6] = -(*(char *)((long)&pIVar20->y + 2) == *(char *)((long)&pIVar23->y + 2)),
             auVar25[7] = -(*(char *)((long)&pIVar20->y + 3) == *(char *)((long)&pIVar23->y + 3)),
             auVar25[8] = -(*(char *)&pIVar20->z == *(char *)&pIVar23->z),
             auVar25[9] = -(*(char *)((long)&pIVar20->z + 1) == *(char *)((long)&pIVar23->z + 1)),
             auVar25[10] = -(*(char *)((long)&pIVar20->z + 2) == *(char *)((long)&pIVar23->z + 2)),
             auVar25[0xb] = -(*(char *)((long)&pIVar20->z + 3) == *(char *)((long)&pIVar23->z + 3)),
             auVar25[0xc] = -(*(char *)&pIVar20->w == *(char *)&pIVar23->w),
             auVar25[0xd] = -(*(char *)((long)&pIVar20->w + 1) == *(char *)((long)&pIVar23->w + 1)),
             auVar25[0xe] = -(*(char *)((long)&pIVar20->w + 2) == *(char *)((long)&pIVar23->w + 2)),
             auVar25[0xf] = -(*(char *)((long)&pIVar20->w + 3) == *(char *)((long)&pIVar23->w + 3)),
             (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff)) {
            sVar13 = strlen(pcVar12);
            LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                    (double)pIVar23->x,(double)pIVar23->y,(double)pIVar23->z,(double)pIVar23->w,
                    pcVar12,(ulong)(0x17 - (int)sVar13),"");
          }
          lVar17 = lVar17 + 1;
          pIVar20 = pIVar20 + 1;
          pIVar23 = pIVar23 + 1;
        } while (lVar17 != 0x30);
        LogFinish();
      }
      SameLine(0.0,-1.0);
      SetNextItemWidth(120.0);
      Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      SameLine(0.0,-1.0);
      Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
        iVar19 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
        if (iVar19 != 0) {
          ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
          __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
          __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
        }
      }
      fVar24 = GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar24 * 16.0);
      bVar7 = RadioButton("Opaque",ShowStyleEditor::alpha_flags == 0);
      if (bVar7) {
        ShowStyleEditor::alpha_flags = 0;
      }
      SameLine(0.0,-1.0);
      bVar7 = RadioButton("Alpha",ShowStyleEditor::alpha_flags == 0x20000);
      pIVar11 = local_b8;
      if (bVar7) {
        ShowStyleEditor::alpha_flags = 0x20000;
      }
      SameLine(0.0,-1.0);
      bVar7 = RadioButton("Both",ShowStyleEditor::alpha_flags == 0x40000);
      if (bVar7) {
        ShowStyleEditor::alpha_flags = 0x40000;
      }
      SameLine(0.0,-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on color square to open color picker,\nRight-click to open edit options menu."
                );
      local_c8.x = 0.0;
      local_c8.y = 0.0;
      BeginChild("##colors",(ImVec2 *)&local_c8,true,0x80c000);
      PushItemWidth(-160.0);
      pIVar23 = pIVar11->Colors;
      pIVar20 = __dest->Colors;
      lVar17 = 0;
      do {
        pcVar12 = GetStyleColorName((ImGuiCol)lVar17);
        bVar7 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar12,(char *)0x0);
        if (bVar7) {
          PushID((ImGuiCol)lVar17);
          ColorEdit4("##color",&pIVar23->x,ShowStyleEditor::alpha_flags | 0x10000);
          auVar26[0] = -(*(char *)&pIVar20->x == *(char *)&pIVar23->x);
          auVar26[1] = -(*(char *)((long)&pIVar20->x + 1) == *(char *)((long)&pIVar23->x + 1));
          auVar26[2] = -(*(char *)((long)&pIVar20->x + 2) == *(char *)((long)&pIVar23->x + 2));
          auVar26[3] = -(*(char *)((long)&pIVar20->x + 3) == *(char *)((long)&pIVar23->x + 3));
          auVar26[4] = -(*(char *)&pIVar20->y == *(char *)&pIVar23->y);
          auVar26[5] = -(*(char *)((long)&pIVar20->y + 1) == *(char *)((long)&pIVar23->y + 1));
          auVar26[6] = -(*(char *)((long)&pIVar20->y + 2) == *(char *)((long)&pIVar23->y + 2));
          auVar26[7] = -(*(char *)((long)&pIVar20->y + 3) == *(char *)((long)&pIVar23->y + 3));
          auVar26[8] = -(*(char *)&pIVar20->z == *(char *)&pIVar23->z);
          auVar26[9] = -(*(char *)((long)&pIVar20->z + 1) == *(char *)((long)&pIVar23->z + 1));
          auVar26[10] = -(*(char *)((long)&pIVar20->z + 2) == *(char *)((long)&pIVar23->z + 2));
          auVar26[0xb] = -(*(char *)((long)&pIVar20->z + 3) == *(char *)((long)&pIVar23->z + 3));
          auVar26[0xc] = -(*(char *)&pIVar20->w == *(char *)&pIVar23->w);
          auVar26[0xd] = -(*(char *)((long)&pIVar20->w + 1) == *(char *)((long)&pIVar23->w + 1));
          auVar26[0xe] = -(*(char *)((long)&pIVar20->w + 2) == *(char *)((long)&pIVar23->w + 2));
          auVar26[0xf] = -(*(char *)((long)&pIVar20->w + 3) == *(char *)((long)&pIVar23->w + 3));
          if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar26[0xf] >> 7) << 0xf) != 0xffff) {
            SameLine(0.0,(local_b8->ItemInnerSpacing).x);
            local_c8.x = 0.0;
            local_c8.y = 0.0;
            bVar7 = Button("Save",(ImVec2 *)&local_c8);
            if (bVar7) {
              fVar24 = pIVar23->y;
              fVar4 = pIVar23->z;
              fVar5 = pIVar23->w;
              pIVar20->x = pIVar23->x;
              pIVar20->y = fVar24;
              pIVar20->z = fVar4;
              pIVar20->w = fVar5;
            }
            SameLine(0.0,(local_b8->ItemInnerSpacing).x);
            local_c8.x = 0.0;
            local_c8.y = 0.0;
            bVar7 = Button("Revert",(ImVec2 *)&local_c8);
            if (bVar7) {
              fVar24 = pIVar20->y;
              fVar4 = pIVar20->z;
              fVar5 = pIVar20->w;
              pIVar23->x = pIVar20->x;
              pIVar23->y = fVar24;
              pIVar23->z = fVar4;
              pIVar23->w = fVar5;
            }
          }
          SameLine(0.0,(local_b8->ItemInnerSpacing).x);
          TextUnformatted(pcVar12,(char *)0x0);
          PopID();
        }
        lVar17 = lVar17 + 1;
        pIVar20 = pIVar20 + 1;
        pIVar23 = pIVar23 + 1;
      } while (lVar17 != 0x30);
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar7 = BeginTabItem("Fonts",(bool *)0x0,0);
    pIVar11 = local_b8;
    if (bVar7) {
      local_68 = GetIO();
      pIVar21 = local_68->Fonts;
      HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
      PushItemWidth(120.0);
      if (0 < (pIVar21->Fonts).Size) {
        lVar17 = 0;
        local_60 = pIVar21;
        do {
          font = (pIVar21->Fonts).Data[lVar17];
          local_58 = lVar17;
          PushID(font);
          pIVar14 = GetIO();
          local_50 = GetStyle();
          pcVar12 = font->ConfigData->Name;
          if (font->ConfigData == (ImFontConfig *)0x0) {
            pcVar12 = "";
          }
          bVar7 = TreeNode(font,"Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
                           (double)font->FontSize,pcVar12,(ulong)(uint)(font->Glyphs).Size,
                           (ulong)(uint)(int)font->ConfigDataCount);
          SameLine(0.0,-1.0);
          bVar8 = SmallButton("Set as default");
          if (bVar8) {
            pIVar14->FontDefault = font;
          }
          if (bVar7) {
            PushFont(font);
            Text("The quick brown fox jumps over the lazy dog");
            PopFont();
            DragFloat("Font scale",&font->Scale,0.005,0.3,2.0,"%.1f",0);
            SameLine(0.0,-1.0);
            HelpMarker(
                      "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)"
                      );
            Text("Ascent: %f, Descent: %f, Height: %f",(double)font->Ascent,(double)font->Descent,
                 (double)(font->Ascent - font->Descent));
            Text("Fallback character: \'%c\' (U+%04X)",(ulong)font->FallbackChar);
            Text("Ellipsis character: \'%c\' (U+%04X)",(ulong)font->EllipsisChar);
            fVar24 = (float)font->MetricsTotalSurface;
            if (fVar24 < 0.0) {
              fVar24 = sqrtf(fVar24);
            }
            else {
              fVar24 = SQRT(fVar24);
            }
            Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)font->MetricsTotalSurface,
                 (ulong)(uint)(int)fVar24);
            sVar9 = font->ConfigDataCount;
            if (0 < sVar9) {
              lVar17 = 0x56;
              uVar22 = 0;
              do {
                pIVar3 = font->ConfigData;
                if (pIVar3 != (ImFontConfig *)0x0) {
                  BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)"
                             ,(double)*(float *)(pIVar3->Name + lVar17 + -0x80),
                             (double)*(float *)(pIVar3->Name + lVar17 + -0x7c),uVar22 & 0xffffffff,
                             pIVar3->Name + lVar17 + -0x56,
                             (ulong)*(uint *)((long)pIVar3 + lVar17 + -0x3e),
                             (ulong)*(uint *)((long)pIVar3 + lVar17 + -0x3a),
                             (ulong)*(byte *)((long)pIVar3 + lVar17 + -0x36));
                  sVar9 = font->ConfigDataCount;
                }
                uVar22 = uVar22 + 1;
                lVar17 = lVar17 + 0x88;
              } while ((long)uVar22 < (long)sVar9);
            }
            bVar7 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(font->Glyphs).Size);
            if (bVar7) {
              ptr_id = (void *)0x0;
              local_9c = GetColorU32(0,1.0);
              do {
                c_begin = (uint)ptr_id;
                if (((ulong)ptr_id & 0xfff) == 0) {
                  bVar7 = ImFont::IsGlyphRangeUnused(font,c_begin,c_begin | 0xfff);
                  if (!bVar7) goto LAB_00148fbb;
                  c_begin = c_begin | 0xf00;
                }
                else {
LAB_00148fbb:
                  uVar18 = 0;
                  iVar19 = 0;
                  do {
                    pIVar15 = ImFont::FindGlyphNoFallback(font,(short)iVar19 + (short)ptr_id);
                    uVar18 = (uVar18 + 1) - (uint)(pIVar15 == (ImFontGlyph *)0x0);
                    iVar19 = iVar19 + 1;
                  } while (iVar19 != 0x100);
                  if (uVar18 != 0) {
                    pcVar12 = "glyphs";
                    if (uVar18 == 1) {
                      pcVar12 = "glyph";
                    }
                    bVar7 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",ptr_id,(ulong)(c_begin + 0xff),
                                     (ulong)uVar18,pcVar12);
                    if (bVar7) {
                      local_a8 = (float *)CONCAT44(local_a8._4_4_,font->FontSize);
                      local_ac = (local_50->ItemSpacing).y + font->FontSize;
                      local_98 = GetCursorScreenPos();
                      pIVar16 = GetWindowDrawList();
                      local_78 = local_98.y;
                      fStack_74 = local_98.y;
                      fStack_70 = local_98.y;
                      fStack_6c = local_98.y;
                      uVar22 = 0;
                      do {
                        uVar18 = (uint)uVar22;
                        local_c8.x = (float)(uVar18 & 0xf) * local_ac + local_98.x;
                        local_c8.y = (float)(int)(uVar22 >> 4) * local_ac + local_78;
                        local_88.y = local_c8.y + local_a8._0_4_;
                        local_88.x = local_c8.x + local_a8._0_4_;
                        c = (ImWchar)(uVar18 + c_begin);
                        pIVar15 = ImFont::FindGlyphNoFallback(font,c);
                        IVar10 = 0x64ffffff;
                        if (pIVar15 == (ImFontGlyph *)0x0) {
                          IVar10 = 0x32ffffff;
                        }
                        ImDrawList::AddRect(pIVar16,(ImVec2 *)&local_c8,(ImVec2 *)&local_88,IVar10,
                                            0.0,0xf,1.0);
                        if (pIVar15 != (ImFontGlyph *)0x0) {
                          ImFont::RenderChar(font,pIVar16,local_a8._0_4_,(ImVec2)local_c8._0_8_,
                                             local_9c,c);
                          bVar7 = IsMouseHoveringRect((ImVec2 *)&local_c8,(ImVec2 *)&local_88,true);
                          if (bVar7) {
                            BeginTooltip();
                            Text("Codepoint: U+%04X",(ulong)(uVar18 + c_begin));
                            Separator();
                            Text("Visible: %d",(ulong)(*(uint *)pIVar15 >> 0x1f));
                            Text("AdvanceX: %.1f",(double)pIVar15->AdvanceX);
                            Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar15->X0,
                                 (double)pIVar15->Y0,(double)pIVar15->X1,(double)pIVar15->Y1);
                            Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar15->U0,
                                 (double)pIVar15->V0,(double)pIVar15->U1,(double)pIVar15->V1);
                            EndTooltip();
                          }
                        }
                        uVar22 = (ulong)(uVar18 + 1);
                      } while (uVar18 + 1 != 0x100);
                      local_c8.y = local_ac * 16.0;
                      local_c8.x = local_ac * 16.0;
                      Dummy((ImVec2 *)&local_c8);
                      TreePop();
                    }
                  }
                }
                ptr_id = (void *)(ulong)(c_begin + 0x100);
              } while (c_begin + 0x100 < 0x10000);
              TreePop();
              pIVar11 = local_b8;
              pIVar21 = local_60;
            }
            TreePop();
          }
          PopID();
          lVar17 = local_58 + 1;
        } while (lVar17 < (pIVar21->Fonts).Size);
      }
      bVar7 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)pIVar21->TexWidth
                       ,(ulong)(uint)pIVar21->TexHeight);
      if (bVar7) {
        local_c8.x = 1.0;
        local_c8.y = 1.0;
        local_c8.z = 1.0;
        local_c8.w = 1.0;
        local_88.x = 1.0;
        local_88.y = 1.0;
        local_88.z = 1.0;
        local_88.w = 0.5;
        uVar1 = pIVar21->TexWidth;
        uVar2 = pIVar21->TexHeight;
        local_38.x = (float)(int)uVar1;
        local_38.y = (float)(int)uVar2;
        local_40.x = 0.0;
        local_40.y = 0.0;
        local_48.x = 1.0;
        local_48.y = 1.0;
        Image(pIVar21->TexID,&local_38,&local_40,&local_48,&local_c8,&local_88);
        TreePop();
      }
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\nUsing those settings here will give you poor quality results."
                );
      bVar7 = DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",0x10);
      if (bVar7) {
        SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      DragFloat("global scale",&local_68->FontGlobalScale,0.005,0.3,2.0,"%.2f",0x10);
      PopItemWidth();
      EndTabItem();
    }
    bVar7 = BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar7) {
      Checkbox("Anti-aliased lines",&pIVar11->AntiAliasedLines);
      SameLine(0.0,-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      Checkbox("Anti-aliased lines use texture",&pIVar11->AntiAliasedLinesUseTex);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering)."
                );
      Checkbox("Anti-aliased fill",&pIVar11->AntiAliasedFill);
      PushItemWidth(100.0);
      DragFloat("Curve Tessellation Tolerance",&pIVar11->CurveTessellationTol,0.02,0.1,10.0,"%.2f",0
               );
      if (pIVar11->CurveTessellationTol <= 0.1 && pIVar11->CurveTessellationTol != 0.1) {
        pIVar11->CurveTessellationTol = 0.1;
      }
      iVar19 = 0;
      DragFloat("Circle Segment Max Error",&pIVar11->CircleSegmentMaxError,0.01,0.1,10.0,"%.2f",0);
      bVar7 = IsItemActive();
      if (bVar7) {
        local_c8._0_8_ = GetCursorScreenPos();
        local_88.x = 0.0;
        local_88.y = 0.0;
        SetNextWindowPos((ImVec2 *)&local_c8,0,(ImVec2 *)&local_88);
        BeginTooltip();
        local_98 = GetCursorScreenPos();
        pIVar16 = GetWindowDrawList();
        local_78 = local_98.y + 80.0;
        fStack_74 = local_98.y;
        fStack_70 = local_98.y;
        fStack_6c = local_98.y;
        local_c8.x = 10.0;
        do {
          local_ac = local_c8.x;
          fVar24 = ((float)iVar19 * 70.0) / 6.0 + 10.0;
          local_a8 = (float *)CONCAT44(local_a8._4_4_,fVar24);
          local_c8.y = local_78;
          local_c8.x = local_98.x + local_ac + fVar24;
          IVar10 = GetColorU32(0,1.0);
          ImDrawList::AddCircle(pIVar16,(ImVec2 *)&local_c8,local_a8._0_4_,IVar10,0,1.0);
          local_c8.x = local_a8._0_4_ + local_a8._0_4_ + 10.0 + local_ac;
          iVar19 = iVar19 + 1;
        } while (iVar19 != 7);
        local_c8.y = 160.0;
        Dummy((ImVec2 *)&local_c8);
        EndTooltip();
      }
      SameLine(0.0,-1.0);
      HelpMarker(
                "When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically."
                );
      DragFloat("Global Alpha",&pIVar11->Alpha,0.005,0.2,1.0,"%.2f",0);
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to
    // (without a reference style pointer, we will use one compared locally as a reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings (expose floating-pointer border sizes as boolean representing 0.0f or 1.0f)
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &border)) { style.WindowBorderSize = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.FrameBorderSize > 0.0f);  if (ImGui::Checkbox("FrameBorder",  &border)) { style.FrameBorderSize  = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.PopupBorderSize > 0.0f);  if (ImGui::Checkbox("PopupBorder",  &border)) { style.PopupBorderSize  = border ? 1.0f : 0.0f; } }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker(
        "Save/Revert in local non-persistent storage. Default Colors definition are not affected. "
        "Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("LogSliderDeadzone", &style.LogSliderDeadzone, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding");
            ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE,
                            name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            if (ImGui::RadioButton("Opaque", alpha_flags == ImGuiColorEditFlags_None))             { alpha_flags = ImGuiColorEditFlags_None; } ImGui::SameLine();
            if (ImGui::RadioButton("Alpha",  alpha_flags == ImGuiColorEditFlags_AlphaPreview))     { alpha_flags = ImGuiColorEditFlags_AlphaPreview; } ImGui::SameLine();
            if (ImGui::RadioButton("Both",   alpha_flags == ImGuiColorEditFlags_AlphaPreviewHalf)) { alpha_flags = ImGuiColorEditFlags_AlphaPreviewHalf; } ImGui::SameLine();
            HelpMarker(
                "In the color list:\n"
                "Left-click on color square to open color picker,\n"
                "Right-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font,
                    // so instead of "Save"/"Revert" you'd use icons!
                    // Read the FAQ and docs/FONTS.md about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) { ref->Colors[i] = style.Colors[i]; }
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) { style.Colors[i] = ref->Colors[i]; }
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                NodeFont(font);
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            // Post-baking font scaling. Note that this is NOT the nice way of scaling fonts, read below.
            // (we enforce hard clamping manually as by default DragFloat/SliderFloat allows CTRL+Click text to get out of bounds).
            const float MIN_SCALE = 0.3f;
            const float MAX_SCALE = 2.0f;
            HelpMarker(
                "Those are old settings provided for convenience.\n"
                "However, the _correct_ way of scaling your UI is currently to reload your font at the designed size, "
                "rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\n"
                "Using those settings here will give you poor quality results.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp)) // Scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp); // Scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines);
            ImGui::SameLine();
            HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");

            ImGui::Checkbox("Anti-aliased lines use texture", &style.AntiAliasedLinesUseTex);
            ImGui::SameLine();
            HelpMarker("Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering).");

            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, 10.0f, "%.2f");
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;

            // When editing the "Circle Segment Max Error" value, draw a preview of its effect on auto-tessellated circles.
            ImGui::DragFloat("Circle Segment Max Error", &style.CircleSegmentMaxError, 0.01f, 0.10f, 10.0f, "%.2f");
            if (ImGui::IsItemActive())
            {
                ImGui::SetNextWindowPos(ImGui::GetCursorScreenPos());
                ImGui::BeginTooltip();
                ImVec2 p = ImGui::GetCursorScreenPos();
                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                float RAD_MIN = 10.0f, RAD_MAX = 80.0f;
                float off_x = 10.0f;
                for (int n = 0; n < 7; n++)
                {
                    const float rad = RAD_MIN + (RAD_MAX - RAD_MIN) * (float)n / (7.0f - 1.0f);
                    draw_list->AddCircle(ImVec2(p.x + off_x + rad, p.y + RAD_MAX), rad, ImGui::GetColorU32(ImGuiCol_Text), 0);
                    off_x += 10.0f + rad * 2.0f;
                }
                ImGui::Dummy(ImVec2(off_x, RAD_MAX * 2.0f));
                ImGui::EndTooltip();
            }
            ImGui::SameLine();
            HelpMarker("When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically.");

            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}